

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::InsertIncrLoopBodyLoopCounter(IRBuilder *this,LabelInstr *loopTopLabelInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  Instr *instr;
  Instr *insertBeforeInstr;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1e39,"(this->IsLoopBody())","this->IsLoopBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dstOpnd = IR::RegOpnd::New(this->m_loopCounterSym,TyInt32,this->m_func);
  instr = IR::Instr::New(IncrLoopBodyCount,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
  IR::Opnd::SetIsJITOptimizedReg(&dstOpnd->super_Opnd,true);
  insertBeforeInstr = IR::Instr::GetNextRealInstr(&loopTopLabelInstr->super_Instr);
  InsertInstr(this,instr,insertBeforeInstr);
  return;
}

Assistant:

void
IRBuilder::InsertIncrLoopBodyLoopCounter(IR::LabelInstr *loopTopLabelInstr)
{
    Assert(this->IsLoopBody());

    IR::RegOpnd *loopCounterOpnd = IR::RegOpnd::New(m_loopCounterSym, TyInt32, this->m_func);
    IR::Instr * incr = IR::Instr::New(Js::OpCode::IncrLoopBodyCount, loopCounterOpnd, loopCounterOpnd, this->m_func);
    loopCounterOpnd->SetIsJITOptimizedReg(true);

    IR::Instr* nextRealInstr = loopTopLabelInstr->GetNextRealInstr();
    InsertInstr(incr, nextRealInstr);
}